

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

Value * __thiscall
minja::SubscriptExpr::do_evaluate
          (Value *__return_storage_ptr__,SubscriptExpr *this,shared_ptr<minja::Context> *context)

{
  Expression *pEVar1;
  element_type *peVar2;
  element_type *peVar3;
  int iVar4;
  long lVar5;
  size_t index;
  size_t sVar6;
  size_t sVar7;
  Value *v;
  runtime_error *prVar8;
  char *pcVar9;
  long i;
  Value target_value;
  string s;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  vector<minja::Value,_std::allocator<minja::Value>_> local_f8;
  Value local_e0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pEVar1 = (this->base).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (pEVar1 == (Expression *)0x0) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"SubscriptExpr.base is null");
LAB_001abaec:
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((this->index).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"SubscriptExpr.index is null");
    goto LAB_001abaec;
  }
  Expression::evaluate(&target_value,pEVar1,context);
  pEVar1 = (this->index).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (pEVar1 != (Expression *)0x0) {
    lVar5 = __dynamic_cast(pEVar1,&Expression::typeinfo,&SliceExpr::typeinfo);
    if (lVar5 != 0) {
      if (*(Expression **)(lVar5 + 0x20) == (Expression *)0x0) {
        index = 0;
      }
      else {
        Expression::evaluate((Value *)&s,*(Expression **)(lVar5 + 0x20),context);
        index = Value::get<long>((Value *)&s);
        Value::~Value((Value *)&s);
      }
      if (*(Expression **)(lVar5 + 0x30) == (Expression *)0x0) {
        sVar6 = Value::size(&target_value);
      }
      else {
        Expression::evaluate((Value *)&s,*(Expression **)(lVar5 + 0x30),context);
        sVar6 = Value::get<long>((Value *)&s);
        Value::~Value((Value *)&s);
      }
      if (target_value.primitive_.m_data.m_type == string) {
        Value::get<std::__cxx11::string>(&s,&target_value);
        std::__cxx11::string::substr((ulong)&local_e0,(ulong)&s);
        Value::Value(__return_storage_ptr__,(string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&s);
      }
      else {
        if (target_value.array_.
            super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr == (element_type *)0x0) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          pcVar9 = "Cannot subscript null";
          if (target_value.callable_.
              super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr != (element_type *)0x0) {
            pcVar9 = "Subscripting only supported on arrays and strings";
          }
          if (target_value.primitive_.m_data.m_type != null) {
            pcVar9 = "Subscripting only supported on arrays and strings";
          }
          if (target_value.array_.
              super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr != (element_type *)0x0 ||
              target_value.object_.
              super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr != (element_type *)0x0) {
            pcVar9 = "Subscripting only supported on arrays and strings";
          }
          std::runtime_error::runtime_error(prVar8,pcVar9);
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if ((long)index < 0) {
          sVar7 = Value::size(&target_value);
          index = index + sVar7;
        }
        if ((long)sVar6 < 0) {
          sVar7 = Value::size(&target_value);
          sVar6 = sVar6 + sVar7;
        }
        local_f8.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_f8.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_f8.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        Value::array(__return_storage_ptr__,&local_f8);
        std::vector<minja::Value,_std::allocator<minja::Value>_>::~vector(&local_f8);
        for (; (long)index < (long)sVar6; index = index + 1) {
          v = Value::at(&target_value,index);
          Value::push_back(__return_storage_ptr__,v);
        }
      }
      goto LAB_001aba22;
    }
  }
  Expression::evaluate((Value *)&s,pEVar1,context);
  if ((((target_value.object_.
         super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr == (element_type *)0x0) &&
       (target_value.array_.
        super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0)) && (target_value.primitive_.m_data.m_type == null)) &&
     (target_value.callable_.
      super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0)) {
    peVar2 = (this->base).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 != (element_type *)0x0) {
      lVar5 = __dynamic_cast(peVar2,&Expression::typeinfo,&VariableExpr::typeinfo);
      if (lVar5 != 0) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string((string *)&local_70,(string *)(lVar5 + 0x20));
        std::operator+(&local_50,"\'",&local_70);
        std::operator+(&local_138,&local_50,"\' is ");
        peVar3 = (context->super___shared_ptr<minja::Context,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::__cxx11::string::string((string *)&local_90,(string *)(lVar5 + 0x20));
        Value::Value(&local_e0,&local_90);
        iVar4 = (*peVar3->_vptr_Context[4])(peVar3,&local_e0);
        pcVar9 = "not defined";
        if ((char)iVar4 != '\0') {
          pcVar9 = "null";
        }
        std::operator+(&local_118,&local_138,pcVar9);
        std::runtime_error::runtime_error(prVar8,(string *)&local_118);
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    Value::dump_abi_cxx11_(&local_138,(Value *)&s,-1,false);
    std::operator+(&local_118,"Trying to access property \'",&local_138);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0,
                   &local_118,"\' on null!");
    std::runtime_error::runtime_error(prVar8,(string *)&local_e0);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Value::get(__return_storage_ptr__,&target_value,(Value *)&s);
  Value::~Value((Value *)&s);
LAB_001aba22:
  Value::~Value(&target_value);
  return __return_storage_ptr__;
}

Assistant:

Value do_evaluate(const std::shared_ptr<Context> & context) const override {
        if (!base) throw std::runtime_error("SubscriptExpr.base is null");
        if (!index) throw std::runtime_error("SubscriptExpr.index is null");
        auto target_value = base->evaluate(context);
        if (auto slice = dynamic_cast<SliceExpr*>(index.get())) {
          auto start = slice->start ? slice->start->evaluate(context).get<int64_t>() : 0;
          auto end = slice->end ? slice->end->evaluate(context).get<int64_t>() : (int64_t) target_value.size();
          if (target_value.is_string()) {
            std::string s = target_value.get<std::string>();
            if (start < 0) start = s.size() + start;
            if (end < 0) end = s.size() + end;
            return s.substr(start, end - start);
          } else if (target_value.is_array()) {
            if (start < 0) start = target_value.size() + start;
            if (end < 0) end = target_value.size() + end;
            auto result = Value::array();
            for (auto i = start; i < end; ++i) {
              result.push_back(target_value.at(i));
            }
            return result;
          } else {
            throw std::runtime_error(target_value.is_null() ? "Cannot subscript null" : "Subscripting only supported on arrays and strings");
          }
        } else {
          auto index_value = index->evaluate(context);
          if (target_value.is_null()) {
            if (auto t = dynamic_cast<VariableExpr*>(base.get())) {
              throw std::runtime_error("'" + t->get_name() + "' is " + (context->contains(t->get_name()) ? "null" : "not defined"));
            }
            throw std::runtime_error("Trying to access property '" +  index_value.dump() + "' on null!");
          }
          return target_value.get(index_value);
        }
    }